

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gennorm2.cpp
# Opt level: O0

void icu_63::parseFile(ifstream *f,Normalizer2DataBuilder *builder)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  UErrorCode UVar4;
  istream *piVar5;
  ulong uVar6;
  UErrorCode *pUVar7;
  char *pcVar8;
  uint local_14c;
  UChar32 c_2;
  undefined1 local_140 [8];
  UnicodeString mapping;
  UChar local_f8 [2];
  int32_t length;
  UChar uchars [31];
  uint local_b0;
  uint local_ac;
  UChar32 c_1;
  UChar32 c;
  unsigned_long value;
  char *end;
  char *s_1;
  char *pcStack_88;
  int32_t rangeLength;
  char *delimiter;
  char *s;
  char *comment;
  char *line;
  uint local_58;
  uint local_54;
  uint32_t endCP;
  uint32_t startCP;
  string lineString;
  undefined1 local_30 [8];
  IcuToolErrorCode errorCode;
  Normalizer2DataBuilder *builder_local;
  ifstream *f_local;
  
  errorCode.location = (char *)builder;
  IcuToolErrorCode::IcuToolErrorCode((IcuToolErrorCode *)local_30,"gennorm2/parseFile()");
  std::__cxx11::string::string((string *)&endCP);
  while( true ) {
    while( true ) {
      do {
        do {
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)f,(string *)&endCP);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
          if (!bVar1) {
            std::__cxx11::string::~string((string *)&endCP);
            IcuToolErrorCode::~IcuToolErrorCode((IcuToolErrorCode *)local_30);
            return;
          }
          uVar6 = std::__cxx11::string::empty();
        } while ((uVar6 & 1) != 0);
        comment = (char *)std::__cxx11::string::front();
        s = strchr(comment,0x23);
        if (s != (char *)0x0) {
          *s = '\0';
        }
        u_rtrim(comment);
        pcVar8 = comment;
      } while (*comment == '\0');
      if (*comment != '*') break;
      delimiter = u_skipWhitespace(comment + 1);
      iVar3 = strncmp(delimiter,"Unicode",7);
      if (iVar3 == 0) {
        delimiter = u_skipWhitespace(delimiter + 7);
        Normalizer2DataBuilder::setUnicodeVersion
                  ((Normalizer2DataBuilder *)errorCode.location,delimiter);
      }
    }
    pUVar7 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_30);
    s_1._4_4_ = u_parseCodePointRangeAnyTerminator
                          (pcVar8,&local_54,&local_58,&stack0xffffffffffffff78,pUVar7);
    UVar2 = ErrorCode::isFailure((ErrorCode *)local_30);
    if (UVar2 != '\0') break;
    if ((0xd7ff < local_58) && (local_54 < 0xe000)) {
      fprintf(_stderr,"gennorm2 error: value or mapping for surrogate code points: %s\n",comment);
      exit(1);
    }
    pcStack_88 = u_skipWhitespace(pcStack_88);
    if (*pcStack_88 == ':') {
      end = u_skipWhitespace(pcStack_88 + 1);
      uVar6 = strtoul(end,(char **)&value,10);
      if (((value <= end) || (pcVar8 = u_skipWhitespace((char *)value), *pcVar8 != '\0')) ||
         (0xfe < uVar6)) {
        fprintf(_stderr,"gennorm2 error: parsing ccc from %s\n",comment);
        exit(9);
      }
      for (local_ac = local_54; (int)local_ac <= (int)local_58; local_ac = local_ac + 1) {
        c_1._0_1_ = (uint8_t)uVar6;
        Normalizer2DataBuilder::setCC
                  ((Normalizer2DataBuilder *)errorCode.location,local_ac,(uint8_t)c_1);
      }
    }
    else if (*pcStack_88 == '-') {
      pcVar8 = u_skipWhitespace(pcStack_88 + 1);
      if (*pcVar8 != '\0') {
        fprintf(_stderr,"gennorm2 error: parsing remove-mapping %s\n",comment);
        exit(9);
      }
      for (local_b0 = local_54; (int)local_b0 <= (int)local_58; local_b0 = local_b0 + 1) {
        Normalizer2DataBuilder::removeMapping((Normalizer2DataBuilder *)errorCode.location,local_b0)
        ;
      }
    }
    else {
      if ((*pcStack_88 != '=') && (*pcStack_88 != '>')) {
        fprintf(_stderr,"gennorm2 error: unrecognized data line %s\n",comment);
        exit(9);
      }
      pcVar8 = pcStack_88 + 1;
      pUVar7 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_30);
      mapping.fUnion._52_4_ = u_parseString(pcVar8,local_f8,0x1f,(uint32_t *)0x0,pUVar7);
      UVar2 = ErrorCode::isFailure((ErrorCode *)local_30);
      if (UVar2 != '\0') {
        fprintf(_stderr,"gennorm2 error: parsing mapping string from %s\n",comment);
        UVar4 = ErrorCode::reset((ErrorCode *)local_30);
        exit(UVar4);
      }
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffeb8,local_f8);
      UnicodeString::UnicodeString
                ((UnicodeString *)local_140,'\0',(ConstChar16Ptr *)&stack0xfffffffffffffeb8,
                 mapping.fUnion._52_4_);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffeb8);
      if (*pcStack_88 == '=') {
        if (s_1._4_4_ != 1) {
          fprintf(_stderr,"gennorm2 error: round-trip mapping for more than 1 code point on %s\n",
                  comment);
          exit(9);
        }
        Normalizer2DataBuilder::setRoundTripMapping
                  ((Normalizer2DataBuilder *)errorCode.location,local_54,(UnicodeString *)local_140)
        ;
      }
      else {
        for (local_14c = local_54; (int)local_14c <= (int)local_58; local_14c = local_14c + 1) {
          Normalizer2DataBuilder::setOneWayMapping
                    ((Normalizer2DataBuilder *)errorCode.location,local_14c,
                     (UnicodeString *)local_140);
        }
      }
      UnicodeString::~UnicodeString((UnicodeString *)local_140);
    }
  }
  fprintf(_stderr,"gennorm2 error: parsing code point range from %s\n",comment);
  UVar4 = ErrorCode::reset((ErrorCode *)local_30);
  exit(UVar4);
}

Assistant:

void parseFile(std::ifstream &f, Normalizer2DataBuilder &builder) {
    IcuToolErrorCode errorCode("gennorm2/parseFile()");
    std::string lineString;
    uint32_t startCP, endCP;
    while(std::getline(f, lineString)) {
        if (lineString.empty()) {
            continue;  // skip empty lines.
        }
#if (U_CPLUSPLUS_VERSION >= 11)
        char *line = &lineString.front();
#else
        char *line = &lineString.at(0);
#endif
        char *comment=(char *)strchr(line, '#');
        if(comment!=NULL) {
            *comment=0;
        }
        u_rtrim(line);
        if(line[0]==0) {
            continue;  // skip empty and comment-only lines
        }
        if(line[0]=='*') {
            const char *s=u_skipWhitespace(line+1);
            if(0==strncmp(s, "Unicode", 7)) {
                s=u_skipWhitespace(s+7);
                builder.setUnicodeVersion(s);
            }
            continue;  // reserved syntax
        }
        const char *delimiter;
        int32_t rangeLength=
            u_parseCodePointRangeAnyTerminator(line, &startCP, &endCP, &delimiter, errorCode);
        if(errorCode.isFailure()) {
            fprintf(stderr, "gennorm2 error: parsing code point range from %s\n", line);
            exit(errorCode.reset());
        }
        if (endCP >= 0xd800 && startCP <= 0xdfff) {
                fprintf(stderr, "gennorm2 error: value or mapping for surrogate code points: %s\n",
                        line);
                exit(U_ILLEGAL_ARGUMENT_ERROR);
        }
        delimiter=u_skipWhitespace(delimiter);
        if(*delimiter==':') {
            const char *s=u_skipWhitespace(delimiter+1);
            char *end;
            unsigned long value=strtoul(s, &end, 10);
            if(end<=s || *u_skipWhitespace(end)!=0 || value>=0xff) {
                fprintf(stderr, "gennorm2 error: parsing ccc from %s\n", line);
                exit(U_PARSE_ERROR);
            }
            for(UChar32 c=(UChar32)startCP; c<=(UChar32)endCP; ++c) {
                builder.setCC(c, (uint8_t)value);
            }
            continue;
        }
        if(*delimiter=='-') {
            if(*u_skipWhitespace(delimiter+1)!=0) {
                fprintf(stderr, "gennorm2 error: parsing remove-mapping %s\n", line);
                exit(U_PARSE_ERROR);
            }
            for(UChar32 c=(UChar32)startCP; c<=(UChar32)endCP; ++c) {
                builder.removeMapping(c);
            }
            continue;
        }
        if(*delimiter=='=' || *delimiter=='>') {
            UChar uchars[Normalizer2Impl::MAPPING_LENGTH_MASK];
            int32_t length=u_parseString(delimiter+1, uchars, UPRV_LENGTHOF(uchars), NULL, errorCode);
            if(errorCode.isFailure()) {
                fprintf(stderr, "gennorm2 error: parsing mapping string from %s\n", line);
                exit(errorCode.reset());
            }
            UnicodeString mapping(FALSE, uchars, length);
            if(*delimiter=='=') {
                if(rangeLength!=1) {
                    fprintf(stderr,
                            "gennorm2 error: round-trip mapping for more than 1 code point on %s\n",
                            line);
                    exit(U_PARSE_ERROR);
                }
                builder.setRoundTripMapping((UChar32)startCP, mapping);
            } else {
                for(UChar32 c=(UChar32)startCP; c<=(UChar32)endCP; ++c) {
                    builder.setOneWayMapping(c, mapping);
                }
            }
            continue;
        }
        fprintf(stderr, "gennorm2 error: unrecognized data line %s\n", line);
        exit(U_PARSE_ERROR);
    }
}